

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_entropy.c
# Opt level: O2

MPP_RET vp8e_calc_coeff_prob
                  (Vp8ePutBitBuf *bitbuf,RK_S32 (*curr) [4] [8] [3] [11],
                  RK_S32 (*prev) [4] [8] [3] [11])

{
  RK_S32 prob;
  int value;
  long lVar1;
  long lVar2;
  long lVar3;
  RK_S32 (*paRVar4) [11];
  RK_S32 (*paRVar5) [11];
  RK_S32 (*paRVar6) [11];
  RK_S32 (*paRVar7) [11];
  long lVar8;
  RK_S32 (*paRVar9) [11];
  RK_S32 (*paRVar10) [11];
  RK_S32 (*local_78) [11];
  RK_S32 (*local_70) [11];
  RK_S32 (*local_68) [11];
  
  local_78 = (RK_S32 (*) [11])coeff_update_prob_tbl;
  local_70 = (RK_S32 (*) [11])curr;
  local_68 = (RK_S32 (*) [11])prev;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    paRVar4 = local_68;
    paRVar6 = local_78;
    paRVar9 = local_70;
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      paRVar5 = paRVar4;
      paRVar7 = paRVar6;
      paRVar10 = paRVar9;
      for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
        for (lVar8 = 0; lVar8 != 0xb; lVar8 = lVar8 + 1) {
          prob = (*(RK_S32 (*) [3] [11])*paRVar7)[0][lVar8];
          value = (*(RK_S32 (*) [8] [3] [11])*paRVar10)[0][0][lVar8];
          if (value == (*(RK_S32 (*) [8] [3] [11])*paRVar5)[0][0][lVar8]) {
            vp8e_put_bool(bitbuf,prob,0);
          }
          else {
            vp8e_put_bool(bitbuf,prob,1);
            vp8e_put_lit(bitbuf,value,8);
          }
        }
        paRVar7 = paRVar7 + 1;
        paRVar5 = paRVar5 + 1;
        paRVar10 = paRVar10 + 1;
      }
      paRVar6 = paRVar6 + 3;
      paRVar4 = paRVar4 + 3;
      paRVar9 = paRVar9 + 3;
    }
    local_78 = local_78 + 0x18;
    local_68 = local_68 + 0x18;
    local_70 = local_70 + 0x18;
  }
  return MPP_OK;
}

Assistant:

MPP_RET vp8e_calc_coeff_prob(Vp8ePutBitBuf *bitbuf, RK_S32 (*curr)[4][8][3][11],
                             RK_S32 (*prev)[4][8][3][11])
{
    RK_S32 i, j, k, l;
    RK_S32 prob, new, old;

    for (i = 0; i < 4; i++) {
        for (j = 0; j < 8; j++) {
            for (k = 0; k < 3; k++) {
                for (l = 0; l < 11; l++) {
                    prob = coeff_update_prob_tbl[i][j][k][l];
                    old = (RK_S32) (*prev)[i][j][k][l];
                    new = (RK_S32) (*curr)[i][j][k][l];

                    if (new == old) {
                        vp8e_put_bool(bitbuf, prob, 0);
                    } else {
                        vp8e_put_bool(bitbuf, prob, 1);
                        vp8e_put_lit(bitbuf, new, 8);
                    }
                }
            }
        }
    }
    return MPP_OK;
}